

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialog::setComboBoxEditable(QInputDialog *this,bool editable)

{
  QInputDialogPrivate *this_00;
  InputMode IVar1;
  
  this_00 = *(QInputDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QInputDialogPrivate::ensureComboBox(this_00);
  QComboBox::setEditable(this_00->comboBox,editable);
  IVar1 = inputMode(this);
  if (IVar1 != TextInput) {
    return;
  }
  QInputDialogPrivate::chooseRightTextInputWidget(this_00);
  return;
}

Assistant:

void QInputDialog::setComboBoxEditable(bool editable)
{
    Q_D(QInputDialog);
    d->ensureComboBox();
    d->comboBox->setEditable(editable);
    if (inputMode() == TextInput)
        d->chooseRightTextInputWidget();
}